

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ClosePopupToLevel(int remaining)

{
  ImGuiWindow *unaff_RBX;
  ImVector<ImGuiPopupRef> *this;
  int i;
  
  this = &GImGui->OpenPopupStack;
  i = 0;
  if (0 < remaining) {
    i = remaining + -1;
  }
  ImVector<ImGuiPopupRef>::operator[](this,i);
  ImGui::FocusWindow(unaff_RBX);
  ImVector<ImGuiPopupRef>::resize(this,remaining);
  return;
}

Assistant:

static void ClosePopupToLevel(int remaining)
{
    ImGuiContext& g = *GImGui;
    if (remaining > 0)
        ImGui::FocusWindow(g.OpenPopupStack[remaining-1].Window);
    else
        ImGui::FocusWindow(g.OpenPopupStack[0].ParentWindow);
    g.OpenPopupStack.resize(remaining);
}